

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void google::protobuf::internal::ExtensionSet::RegisterExtension
               (MessageLite *containing_type,int number,FieldType type,bool is_repeated,
               bool is_packed)

{
  ExtensionInfo info;
  LogMessage *pLVar1;
  undefined7 in_register_00000011;
  LogFinisher local_f9;
  FieldType local_f8;
  undefined1 uStack_f7;
  undefined1 uStack_f6;
  undefined5 uStack_f5;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if ((int)CONCAT71(in_register_00000011,type) == 0xe) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x85);
    pLVar1 = LogMessage::operator<<
                       (&local_68,"CHECK failed: (type) != (WireFormatLite::TYPE_ENUM): ");
    LogFinisher::operator=((LogFinisher *)&local_a0,pLVar1);
    LogMessage::~LogMessage(&local_68);
  }
  if (type == '\v') {
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x86);
    pLVar1 = LogMessage::operator<<
                       (&local_a0,"CHECK failed: (type) != (WireFormatLite::TYPE_MESSAGE): ");
    LogFinisher::operator=((LogFinisher *)&local_d8,pLVar1);
    LogMessage::~LogMessage(&local_a0);
  }
  if (type == '\n') {
    LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x87);
    pLVar1 = LogMessage::operator<<
                       (&local_d8,"CHECK failed: (type) != (WireFormatLite::TYPE_GROUP): ");
    LogFinisher::operator=(&local_f9,pLVar1);
    LogMessage::~LogMessage(&local_d8);
  }
  uStack_e0 = 0;
  info.is_repeated = is_repeated;
  info.type = type;
  info.is_packed = is_packed;
  info._3_5_ = uStack_f5;
  info.field_3.enum_validity_check.func = (EnumValidityFuncWithArg *)uStack_f0;
  info.field_3.enum_validity_check.arg = (void *)local_e8;
  info.descriptor = (FieldDescriptor *)0x0;
  local_f8 = type;
  uStack_f7 = is_repeated;
  uStack_f6 = is_packed;
  anon_unknown_29::Register(containing_type,number,info);
  return;
}

Assistant:

void ExtensionSet::RegisterExtension(const MessageLite* containing_type,
                                     int number, FieldType type,
                                     bool is_repeated, bool is_packed) {
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_ENUM);
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_MESSAGE);
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(type, is_repeated, is_packed);
  Register(containing_type, number, info);
}